

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O2

size_t ListFile_GetNext(void *pvListFile,char *szMask,char *szBuffer,size_t nMaxChars)

{
  bool bVar1;
  size_t sVar2;
  size_t nLength;
  
  do {
    sVar2 = ListFile_GetNextLine(pvListFile,szBuffer,nMaxChars);
    if (sVar2 == 0) {
      SetLastError(0x3e9);
      return 0;
    }
    bVar1 = CheckWildCard(szBuffer,szMask);
  } while (!bVar1);
  return sVar2;
}

Assistant:

size_t ListFile_GetNext(void * pvListFile, const char * szMask, char * szBuffer, size_t nMaxChars)
{
    size_t nLength = 0;
    int nError = ERROR_SUCCESS;

    // Check for parameters
    for(;;)
    {
        // Read the (next) line
        nLength = ListFile_GetNextLine(pvListFile, szBuffer, nMaxChars);
        if(nLength == 0)
        {
            nError = ERROR_NO_MORE_FILES;
            break;
        }

        // If some mask entered, check it
        if(CheckWildCard(szBuffer, szMask))
        {
            nError = ERROR_SUCCESS;
            break;
        }
    }

    if(nError != ERROR_SUCCESS)
        SetLastError(nError);
    return nLength;
}